

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O2

u64 u64Shuffle(u64 w)

{
  ulong uVar1;
  
  uVar1 = (ulong)(((uint)(w >> 0x10) ^ (uint)w) & 0xffff0000) * 0x10001 ^ w;
  uVar1 = ((uVar1 >> 8 ^ uVar1) & 0xff000000ff00) * 0x101 ^ uVar1;
  uVar1 = ((uVar1 >> 4 ^ uVar1) & 0xf000f000f000f0) * 0x11 ^ uVar1;
  uVar1 = ((uVar1 >> 2 ^ uVar1) & 0xc0c0c0c0c0c0c0c) * 5 ^ uVar1;
  return ((uVar1 >> 1 ^ uVar1) & 0x2222222222222222) * 3 ^ uVar1;
}

Assistant:

u64 u64Shuffle(register u64 w)
{
	register u64 t;
	t = (w ^ (w >> 16)) & 0x00000000FFFF0000, w ^= t ^ (t << 16);
	t = (w ^ (w >> 8)) & 0x0000FF000000FF00, w ^= t ^ (t << 8);
	t = (w ^ (w >> 4)) & 0x00F000F000F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 2)) & 0x0C0C0C0C0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 1)) & 0x2222222222222222, w ^= t ^ (t << 1);
	t = 0;
	return w;
}